

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

double Assimp::FBX::FBXConverter::FrameRateToDouble(FrameRate fp,double customFPSVal)

{
  switch(fp) {
  case FrameRate_DEFAULT:
    customFPSVal = 1.0;
switchD_005e0903_caseD_e:
    return customFPSVal;
  case FrameRate_120:
    return 120.0;
  case FrameRate_100:
    return 100.0;
  case FrameRate_60:
    return 60.0;
  case FrameRate_50:
    return 50.0;
  case FrameRate_48:
    return 48.0;
  case FrameRate_30:
  case FrameRate_30_DROP:
    return 30.0;
  case FrameRate_NTSC_DROP_FRAME:
  case FrameRate_NTSC_FULL_FRAME:
    return 29.9700262;
  case FrameRate_PAL:
    return 25.0;
  case FrameRate_CINEMA:
    return 24.0;
  case FrameRate_1000:
    return 1000.0;
  case FrameRate_CINEMA_ND:
    return 23.976;
  case FrameRate_CUSTOM:
    goto switchD_005e0903_caseD_e;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x9b8,
                  "static double Assimp::FBX::FBXConverter::FrameRateToDouble(FileGlobalSettings::FrameRate, double)"
                 );
  }
}

Assistant:

double FBXConverter::FrameRateToDouble(FileGlobalSettings::FrameRate fp, double customFPSVal) {
            switch (fp) {
            case FileGlobalSettings::FrameRate_DEFAULT:
                return 1.0;

            case FileGlobalSettings::FrameRate_120:
                return 120.0;

            case FileGlobalSettings::FrameRate_100:
                return 100.0;

            case FileGlobalSettings::FrameRate_60:
                return 60.0;

            case FileGlobalSettings::FrameRate_50:
                return 50.0;

            case FileGlobalSettings::FrameRate_48:
                return 48.0;

            case FileGlobalSettings::FrameRate_30:
            case FileGlobalSettings::FrameRate_30_DROP:
                return 30.0;

            case FileGlobalSettings::FrameRate_NTSC_DROP_FRAME:
            case FileGlobalSettings::FrameRate_NTSC_FULL_FRAME:
                return 29.9700262;

            case FileGlobalSettings::FrameRate_PAL:
                return 25.0;

            case FileGlobalSettings::FrameRate_CINEMA:
                return 24.0;

            case FileGlobalSettings::FrameRate_1000:
                return 1000.0;

            case FileGlobalSettings::FrameRate_CINEMA_ND:
                return 23.976;

            case FileGlobalSettings::FrameRate_CUSTOM:
                return customFPSVal;

            case FileGlobalSettings::FrameRate_MAX: // this is to silence compiler warnings
                break;
            }

            ai_assert(false);

            return -1.0f;
        }